

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMS_CLOCK_INFO_Unmarshal(TPMS_CLOCK_INFO *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT64_Unmarshal(&target->clock,buffer,size);
  if (TVar1 == 0) {
    TVar1 = UINT32_Unmarshal(&target->resetCount,buffer,size);
    if (TVar1 == 0) {
      TVar1 = UINT32_Unmarshal(&target->restartCount,buffer,size);
      if (TVar1 == 0) {
        TVar1 = TPMI_YES_NO_Unmarshal(&target->safe,buffer,size);
        return TVar1;
      }
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMS_CLOCK_INFO_Unmarshal(TPMS_CLOCK_INFO *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT64_Unmarshal((UINT64 *)&(target->clock), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT32_Unmarshal((UINT32 *)&(target->resetCount), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT32_Unmarshal((UINT32 *)&(target->restartCount), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_YES_NO_Unmarshal((TPMI_YES_NO *)&(target->safe), buffer, size);
    return result;
}